

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O3

void ecc_weierstrass_get_affine(WeierstrassPoint *wp,mp_int **x,mp_int **y)

{
  WeierstrassCurve *pWVar1;
  mp_int *pmVar2;
  mp_int *x_00;
  mp_int *y_00;
  
  pWVar1 = wp->wc;
  pmVar2 = monty_invert(pWVar1->mc,wp->Z);
  x_00 = monty_mul(pWVar1->mc,pmVar2,pmVar2);
  y_00 = monty_mul(pWVar1->mc,x_00,pmVar2);
  monty_mul_into(pWVar1->mc,wp->X,wp->X,x_00);
  monty_mul_into(pWVar1->mc,wp->Y,wp->Y,y_00);
  monty_mul_into(pWVar1->mc,wp->Z,wp->Z,pmVar2);
  mp_free(pmVar2);
  mp_free(x_00);
  mp_free(y_00);
  if (x != (mp_int **)0x0) {
    pmVar2 = monty_export(pWVar1->mc,wp->X);
    *x = pmVar2;
  }
  if (y != (mp_int **)0x0) {
    pmVar2 = monty_export(pWVar1->mc,wp->Y);
    *y = pmVar2;
  }
  return;
}

Assistant:

void ecc_weierstrass_get_affine(
    WeierstrassPoint *wp, mp_int **x, mp_int **y)
{
    WeierstrassCurve *wc = wp->wc;

    ecc_weierstrass_normalise(wp);

    if (x)
        *x = monty_export(wc->mc, wp->X);
    if (y)
        *y = monty_export(wc->mc, wp->Y);
}